

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2TextureSharingTest::createResource(GLES2TextureSharingTest *this)

{
  glTexImage2DFunc p_Var1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  deBool dVar5;
  PixelBufferAccess *pPVar6;
  void *pvVar7;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  TextureFormat local_70;
  Texture2D local_68;
  int local_18;
  int local_14;
  int height;
  int width;
  GLES2TextureSharingTest *this_local;
  
  local_14 = 0x80;
  local_18 = 0x80;
  _height = this;
  tcu::TextureFormat::TextureFormat(&local_70,RGBA,UNORM_INT8);
  tcu::Texture2D::Texture2D(&local_68,&local_70,local_14,local_18);
  tcu::Texture2D::operator=(&this->m_texture,&local_68);
  tcu::Texture2D::~Texture2D(&local_68);
  tcu::Texture2D::allocLevel(&this->m_texture,0);
  pPVar6 = tcu::TextureLevelPyramid::getLevel(&(this->m_texture).super_TextureLevelPyramid,0);
  tcu::Vector<float,_4>::Vector(&local_8c,0.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_9c,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar6,&local_8c,&local_9c);
  do {
    (*(this->super_GLES2SharingTest).m_gl.genTextures)(1,&this->m_glTexture);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"genTextures(1, &m_glTexture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x1f1);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,this->m_glTexture);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"bindTexture(GL_TEXTURE_2D, m_glTexture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x1f2);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2802,0x2901);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,499);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2803,0x2901);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,500);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2801,0x2601);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x1f5);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.texParameteri)(0xde1,0x2800,0x2601);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x1f6);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    iVar3 = local_14;
    iVar2 = local_18;
    p_Var1 = (this->super_GLES2SharingTest).m_gl.texImage2D;
    pPVar6 = tcu::TextureLevelPyramid::getLevel(&(this->m_texture).super_TextureLevelPyramid,0);
    pvVar7 = tcu::PixelBufferAccess::getDataPtr(pPVar6);
    (*p_Var1)(0xde1,0,0x1908,iVar3,iVar2,0,0x1908,0x1401,pvVar7);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,
                    "texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_texture.getLevel(0).getDataPtr())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x1f7);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,0);
    GVar4 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar4,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x1f8);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  return;
}

Assistant:

void GLES2TextureSharingTest::createResource (void)
{
	int width	= 128;
	int	height	= 128;
	m_texture = tcu::Texture2D(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), width, height);
	m_texture.allocLevel(0);

	tcu::fillWithComponentGradients(m_texture.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, genTextures(1, &m_glTexture));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, m_glTexture));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR));
	GLU_CHECK_GLW_CALL(m_gl, texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR));
	GLU_CHECK_GLW_CALL(m_gl, texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, m_texture.getLevel(0).getDataPtr()));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, 0));
}